

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void icu_63::Calendar::getCalendarTypeFromLocale
               (Locale *aLocale,char *typeBuffer,int32_t typeBufferSize,UErrorCode *success)

{
  char *__dest;
  UBool UVar1;
  int iVar2;
  Calendar *pCVar3;
  undefined4 extraout_var;
  SharedCalendar *local_30;
  SharedCalendar *shared;
  UErrorCode *success_local;
  char *pcStack_18;
  int32_t typeBufferSize_local;
  char *typeBuffer_local;
  Locale *aLocale_local;
  
  local_30 = (SharedCalendar *)0x0;
  shared = (SharedCalendar *)success;
  success_local._4_4_ = typeBufferSize;
  pcStack_18 = typeBuffer;
  typeBuffer_local = (char *)aLocale;
  UnifiedCache::getByLocale<icu_63::SharedCalendar>(aLocale,&local_30,success);
  UVar1 = ::U_FAILURE(*(UErrorCode *)&(shared->super_SharedObject).super_UObject._vptr_UObject);
  __dest = pcStack_18;
  if (UVar1 == '\0') {
    pCVar3 = SharedCalendar::operator->(local_30);
    iVar2 = (*(pCVar3->super_UObject)._vptr_UObject[0x17])();
    strncpy(__dest,(char *)CONCAT44(extraout_var,iVar2),(long)success_local._4_4_);
    SharedObject::removeRef(&local_30->super_SharedObject);
    if (pcStack_18[success_local._4_4_ + -1] != '\0') {
      *(undefined4 *)&(shared->super_SharedObject).super_UObject._vptr_UObject = 0xf;
    }
  }
  return;
}

Assistant:

void U_EXPORT2
Calendar::getCalendarTypeFromLocale(
        const Locale &aLocale,
        char *typeBuffer,
        int32_t typeBufferSize,
        UErrorCode &success) {
    const SharedCalendar *shared = NULL;
    UnifiedCache::getByLocale(aLocale, shared, success);
    if (U_FAILURE(success)) {
        return;
    }
    uprv_strncpy(typeBuffer, (*shared)->getType(), typeBufferSize);
    shared->removeRef();
    if (typeBuffer[typeBufferSize - 1]) {
        success = U_BUFFER_OVERFLOW_ERROR;
    }
}